

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefix.cpp
# Opt level: O0

void duckdb::Prefix::ConcatChildIsGate(ART *art,Node *parent,uint8_t byte,Node *child)

{
  NType NVar1;
  undefined8 *in_RCX;
  undefined8 in_RSI;
  ART *in_RDI;
  Prefix *unaff_retaddr;
  Prefix tail;
  Prefix prefix;
  undefined8 *local_60;
  idx_t in_stack_ffffffffffffffb0;
  Node *in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffc1;
  Node *in_stack_ffffffffffffffc8;
  ART *in_stack_ffffffffffffffd0;
  uint8_t byte_00;
  
  byte_00 = (uint8_t)((ulong)in_RSI >> 0x38);
  NVar1 = Node::GetType((Node *)0x18d3873);
  if (NVar1 == PREFIX) {
    GetTail((ART *)CONCAT71(in_stack_ffffffffffffffc1,in_stack_ffffffffffffffc0),
            in_stack_ffffffffffffffb8);
    Append(unaff_retaddr,in_RDI,byte_00);
    *local_60 = *in_RCX;
  }
  else {
    NewInternal(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                (data_ptr_t)CONCAT71(in_stack_ffffffffffffffc1,in_stack_ffffffffffffffc0),
                (uint8_t)((ulong)in_stack_ffffffffffffffb8 >> 0x38),in_stack_ffffffffffffffb0,
                (NType)in_RCX);
    (in_stack_ffffffffffffffd0->super_BoundIndex).super_Index._vptr_Index = (_func_int **)*in_RCX;
  }
  return;
}

Assistant:

void Prefix::ConcatChildIsGate(ART &art, Node &parent, uint8_t byte, const Node &child) {
	// Create a new prefix and point it to the gate.
	if (parent.GetType() != PREFIX) {
		auto prefix = NewInternal(art, parent, &byte, 1, 0, PREFIX);
		*prefix.ptr = child;
		return;
	}

	auto tail = GetTail(art, parent);
	tail = tail.Append(art, byte);
	*tail.ptr = child;
}